

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O1

string * ApprovalTests::FileUtils::readFileThrowIfMissing
                   (string *__return_storage_ptr__,string *fileName)

{
  runtime_error *this;
  stringstream written;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [4];
  ios_base local_330 [264];
  long local_228 [2];
  streambuf local_218 [16];
  byte abStack_208 [488];
  
  ::std::ifstream::ifstream(local_228,(fileName->_M_dataplus)._M_p,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_3b0);
    ::std::ostream::operator<<(&local_3b0[0].field_2,local_218);
    ::std::ifstream::close();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_3b0);
    ::std::ios_base::~ios_base(local_330);
    ::std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(local_3b0,"File does not exist: ",fileName);
  ::std::runtime_error::runtime_error(this,(string *)local_3b0);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::string FileUtils::readFileThrowIfMissing(const std::string& fileName)
    {
        std::ifstream in(fileName.c_str(), std::ios_base::in);
        if (!in)
        {
            throw std::runtime_error("File does not exist: " + fileName);
        }
        std::stringstream written;
        written << in.rdbuf();
        in.close();

        std::string text = written.str();
        return text;
    }